

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# childgenerator.cpp
# Opt level: O0

string * __thiscall
ChildGenerator::generateCode_abi_cxx11_(string *__return_storage_ptr__,ChildGenerator *this)

{
  string local_40;
  int local_20;
  undefined1 local_19;
  int i;
  ChildGenerator *this_local;
  string *code;
  
  local_19 = 0;
  _i = this;
  this_local = (ChildGenerator *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  for (local_20 = 0; local_20 < this->numFields_; local_20 = local_20 + 1) {
    handleFieldGeneration_abi_cxx11_(&local_40,this,local_20);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ChildGenerator::generateCode() {
  std::string code;

  for(int i = 0; i < numFields_; i++) {
    code += handleFieldGeneration(i);
  }

  return code;
}